

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaYca.cpp
# Opt level: O3

void Imf_2_5::RgbaYca::reconstructChromaVert(int n,Rgba **ycaIn,Rgba *ycaOut)

{
  short sVar1;
  Rgba *pRVar2;
  Rgba *pRVar3;
  Rgba *pRVar4;
  Rgba *pRVar5;
  Rgba *pRVar6;
  Rgba *pRVar7;
  Rgba *pRVar8;
  Rgba *pRVar9;
  Rgba *pRVar10;
  long lVar11;
  Rgba *pRVar12;
  float fVar13;
  Rgba *local_50;
  Rgba *local_48;
  Rgba *local_40;
  
  if (0 < n) {
    lVar11 = 0;
    do {
      pRVar2 = ycaIn[2];
      local_48 = ycaIn[4];
      local_50 = ycaIn[6];
      pRVar7 = ycaIn[8];
      pRVar8 = ycaIn[10];
      pRVar9 = ycaIn[0xc];
      pRVar10 = ycaIn[0xe];
      pRVar6 = ycaIn[0x10];
      pRVar12 = ycaIn[0x12];
      pRVar5 = ycaIn[0x14];
      pRVar3 = ycaIn[0x16];
      pRVar4 = ycaIn[0x18];
      local_40 = ycaIn[0x1a];
      fVar13 = half::_toFloat[*(ushort *)((long)&(local_40->r)._h + lVar11)].f * 0.002128 +
               half::_toFloat[*(ushort *)((long)&(pRVar4->r)._h + lVar11)].f * -0.00754 +
               half::_toFloat[*(ushort *)((long)&(pRVar3->r)._h + lVar11)].f * 0.019597 +
               half::_toFloat[*(ushort *)((long)&(pRVar5->r)._h + lVar11)].f * -0.043159 +
               half::_toFloat[*(ushort *)((long)&(pRVar12->r)._h + lVar11)].f * 0.087929 +
               half::_toFloat[*(ushort *)((long)&(pRVar6->r)._h + lVar11)].f * -0.186077 +
               half::_toFloat[*(ushort *)((long)&(pRVar10->r)._h + lVar11)].f * 0.627123 +
               half::_toFloat[*(ushort *)((long)&(pRVar9->r)._h + lVar11)].f * 0.627123 +
               half::_toFloat[*(ushort *)((long)&(pRVar8->r)._h + lVar11)].f * -0.186077 +
               half::_toFloat[*(ushort *)((long)&(pRVar7->r)._h + lVar11)].f * 0.087929 +
               half::_toFloat[*(ushort *)((long)&(local_50->r)._h + lVar11)].f * -0.043159 +
               half::_toFloat[*(ushort *)((long)&(local_48->r)._h + lVar11)].f * 0.019597 +
               half::_toFloat[*(ushort *)((long)&((*ycaIn)->r)._h + lVar11)].f * 0.002128 +
               half::_toFloat[*(ushort *)((long)&(pRVar2->r)._h + lVar11)].f * -0.00754;
      if ((fVar13 != 0.0) || (NAN(fVar13))) {
        if (half::_eLut[(uint)fVar13 >> 0x17] == 0) {
          sVar1 = half::convert((int)fVar13);
          pRVar2 = ycaIn[2];
          local_48 = ycaIn[4];
          local_50 = ycaIn[6];
          pRVar7 = ycaIn[8];
          pRVar8 = ycaIn[10];
          pRVar9 = ycaIn[0xc];
          pRVar10 = ycaIn[0xe];
          pRVar6 = ycaIn[0x10];
          pRVar12 = ycaIn[0x12];
          pRVar5 = ycaIn[0x14];
          pRVar3 = ycaIn[0x16];
          pRVar4 = ycaIn[0x18];
          local_40 = ycaIn[0x1a];
        }
        else {
          sVar1 = half::_eLut[(uint)fVar13 >> 0x17] +
                  (short)(((uint)fVar13 & 0x7fffff) + 0xfff + (uint)(((uint)fVar13 >> 0xd & 1) != 0)
                         >> 0xd);
        }
      }
      else {
        sVar1 = (short)((uint)fVar13 >> 0x10);
      }
      *(short *)((long)&(ycaOut->r)._h + lVar11) = sVar1;
      fVar13 = half::_toFloat[*(ushort *)((long)&(local_40->b)._h + lVar11)].f * 0.002128 +
               half::_toFloat[*(ushort *)((long)&(pRVar4->b)._h + lVar11)].f * -0.00754 +
               half::_toFloat[*(ushort *)((long)&(pRVar3->b)._h + lVar11)].f * 0.019597 +
               half::_toFloat[*(ushort *)((long)&(pRVar5->b)._h + lVar11)].f * -0.043159 +
               half::_toFloat[*(ushort *)((long)&(pRVar12->b)._h + lVar11)].f * 0.087929 +
               half::_toFloat[*(ushort *)((long)&(pRVar6->b)._h + lVar11)].f * -0.186077 +
               half::_toFloat[*(ushort *)((long)&(pRVar10->b)._h + lVar11)].f * 0.627123 +
               half::_toFloat[*(ushort *)((long)&(pRVar9->b)._h + lVar11)].f * 0.627123 +
               half::_toFloat[*(ushort *)((long)&(pRVar8->b)._h + lVar11)].f * -0.186077 +
               half::_toFloat[*(ushort *)((long)&(pRVar7->b)._h + lVar11)].f * 0.087929 +
               half::_toFloat[*(ushort *)((long)&(local_50->b)._h + lVar11)].f * -0.043159 +
               half::_toFloat[*(ushort *)((long)&(local_48->b)._h + lVar11)].f * 0.019597 +
               half::_toFloat[*(ushort *)((long)&((*ycaIn)->b)._h + lVar11)].f * 0.002128 +
               half::_toFloat[*(ushort *)((long)&(pRVar2->b)._h + lVar11)].f * -0.00754;
      if ((fVar13 != 0.0) || (NAN(fVar13))) {
        if (half::_eLut[(uint)fVar13 >> 0x17] == 0) {
          sVar1 = half::convert((int)fVar13);
        }
        else {
          sVar1 = half::_eLut[(uint)fVar13 >> 0x17] +
                  (short)(((uint)fVar13 & 0x7fffff) + 0xfff + (uint)(((uint)fVar13 >> 0xd & 1) != 0)
                         >> 0xd);
        }
      }
      else {
        sVar1 = (short)((uint)fVar13 >> 0x10);
      }
      *(short *)((long)&(ycaOut->b)._h + lVar11) = sVar1;
      pRVar2 = ycaIn[0xd];
      *(undefined2 *)((long)&(ycaOut->g)._h + lVar11) =
           *(undefined2 *)((long)&(pRVar2->g)._h + lVar11);
      *(undefined2 *)((long)&(ycaOut->a)._h + lVar11) =
           *(undefined2 *)((long)&(pRVar2->a)._h + lVar11);
      lVar11 = lVar11 + 8;
    } while ((ulong)(uint)n << 3 != lVar11);
  }
  return;
}

Assistant:

void
reconstructChromaVert (int n,
		       const Rgba * const ycaIn[N],
		       Rgba ycaOut[/*n*/])
{
    for (int i = 0; i < n; ++i)
    {
	ycaOut[i].r = ycaIn[ 0][i].r *  0.002128f +
		      ycaIn[ 2][i].r * -0.007540f +
		      ycaIn[ 4][i].r *  0.019597f +
		      ycaIn[ 6][i].r * -0.043159f +
		      ycaIn[ 8][i].r *  0.087929f +
		      ycaIn[10][i].r * -0.186077f +
		      ycaIn[12][i].r *  0.627123f +
		      ycaIn[14][i].r *  0.627123f +
		      ycaIn[16][i].r * -0.186077f +
		      ycaIn[18][i].r *  0.087929f +
		      ycaIn[20][i].r * -0.043159f +
		      ycaIn[22][i].r *  0.019597f +
		      ycaIn[24][i].r * -0.007540f +
		      ycaIn[26][i].r *  0.002128f;

	ycaOut[i].b = ycaIn[ 0][i].b *  0.002128f +
		      ycaIn[ 2][i].b * -0.007540f +
		      ycaIn[ 4][i].b *  0.019597f +
		      ycaIn[ 6][i].b * -0.043159f +
		      ycaIn[ 8][i].b *  0.087929f +
		      ycaIn[10][i].b * -0.186077f +
		      ycaIn[12][i].b *  0.627123f +
		      ycaIn[14][i].b *  0.627123f +
		      ycaIn[16][i].b * -0.186077f +
		      ycaIn[18][i].b *  0.087929f +
		      ycaIn[20][i].b * -0.043159f +
		      ycaIn[22][i].b *  0.019597f +
		      ycaIn[24][i].b * -0.007540f +
		      ycaIn[26][i].b *  0.002128f;

	ycaOut[i].g = ycaIn[13][i].g;
	ycaOut[i].a = ycaIn[13][i].a;
    }
}